

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O0

void jpeg_idct_16x16(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                    JSAMPARRAY output_buf,JDIMENSION output_col)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  undefined1 *puVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long in_RCX;
  short *in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  int ctr;
  JSAMPLE *range_limit;
  JSAMPROW outptr;
  int *wsptr;
  ISLOW_MULT_TYPE *quantptr;
  JCOEFPTR inptr;
  JLONG z4;
  JLONG z3;
  JLONG z2;
  JLONG z1;
  JLONG tmp27;
  JLONG tmp26;
  JLONG tmp25;
  JLONG tmp24;
  JLONG tmp23;
  JLONG tmp22;
  JLONG tmp21;
  JLONG tmp20;
  JLONG tmp13;
  JLONG tmp12;
  JLONG tmp11;
  JLONG tmp10;
  JLONG tmp3;
  JLONG tmp2;
  JLONG tmp1;
  JLONG tmp0;
  int local_2f8 [16];
  int local_2b8 [8];
  int local_298 [8];
  int local_278 [8];
  int local_258 [8];
  int local_238 [8];
  int local_218 [8];
  int local_1f8 [8];
  int local_1d8 [8];
  int local_1b8 [8];
  int local_198 [8];
  int local_178 [8];
  int local_158 [8];
  int local_138 [8];
  int local_118 [9];
  int local_f4;
  long local_f0;
  int *local_e0;
  short *local_d8;
  short *local_d0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  uint local_24;
  long local_20;
  
  local_f0 = *(long *)(in_RDI + 0x1a8) + 0x80;
  local_d8 = *(short **)(in_RSI + 0x58);
  local_e0 = local_2f8;
  local_d0 = in_RDX;
  local_24 = in_R8D;
  local_20 = in_RCX;
  for (local_f4 = 0; local_f4 < 8; local_f4 = local_f4 + 1) {
    local_98 = (long)((int)*local_d0 * (int)*local_d8) * 0x2000 + 0x400;
    lVar1 = (long)((int)local_d0[0x20] * (int)local_d8[0x20]);
    local_a8 = local_98 + lVar1 * 0x29cf;
    local_90 = local_98 + lVar1 * -0x29cf;
    local_a0 = local_98 + lVar1 * 0x1151;
    local_98 = local_98 + lVar1 * -0x1151;
    lVar1 = (long)((int)local_d0[0x10] * (int)local_d8[0x10]);
    lVar2 = (long)((int)local_d0[0x30] * (int)local_d8[0x30]);
    lVar3 = (lVar1 - lVar2) * 0x8d4;
    lVar4 = (lVar1 - lVar2) * 0x2c63;
    lVar5 = lVar4 + lVar2 * 0x5203;
    lVar6 = lVar3 + lVar1 * 0x1ccd;
    lVar4 = lVar4 + lVar1 * -0x133e;
    lVar3 = lVar3 + lVar2 * -0x1050;
    local_70 = local_a8 + lVar5;
    local_a8 = local_a8 - lVar5;
    local_78 = local_a0 + lVar6;
    local_a0 = local_a0 - lVar6;
    local_80 = local_98 + lVar4;
    local_98 = local_98 - lVar4;
    local_88 = local_90 + lVar3;
    local_90 = local_90 - lVar3;
    lVar1 = (long)((int)local_d0[8] * (int)local_d8[8]);
    lVar2 = (long)((int)local_d0[0x18] * (int)local_d8[0x18]);
    lVar5 = (long)((int)local_d0[0x28] * (int)local_d8[0x28]);
    lVar6 = (long)((int)local_d0[0x38] * (int)local_d8[0x38]);
    lVar4 = (lVar1 + lVar2) * 0x2b4e;
    lVar3 = (lVar1 + lVar5) * 0x27e9;
    lVar7 = (lVar1 + lVar6) * 0x22fc;
    lVar8 = (lVar1 - lVar6) * 0x1cb6;
    lVar9 = (lVar1 + lVar5) * 0x1555;
    lVar10 = (lVar1 - lVar2) * 0xd23;
    local_30 = lVar4 + lVar3 + lVar7 + lVar1 * -0x492a;
    local_68 = lVar8 + lVar9 + lVar10 + lVar1 * -0x3abe;
    lVar1 = (lVar2 + lVar5) * 0x470;
    lVar11 = (lVar5 - lVar2) * 0x2d09;
    lVar12 = (lVar6 + lVar2) * -0x1555;
    local_38 = lVar12 + lVar1 + lVar2 * 0x24d + lVar4;
    lVar4 = (lVar6 + lVar2) * -0x27e9;
    local_60 = lVar4 + lVar11 + lVar2 * 0x3f1a + lVar10;
    local_48 = (lVar5 + lVar6) * -0x2b4e;
    local_40 = local_48 + lVar1 + lVar5 * -0x2406 + lVar3;
    local_48 = local_48 + lVar12 + lVar6 * 0x2218 + lVar7;
    local_58 = (lVar6 - lVar5) * 0xd23;
    local_50 = local_58 + lVar4 + lVar6 * 0x6485 + lVar8;
    local_58 = local_58 + lVar11 + lVar5 * -0x1886 + lVar9;
    *local_e0 = (int)(local_70 + local_30 >> 0xb);
    local_e0[0x78] = (int)(local_70 - local_30 >> 0xb);
    local_e0[8] = (int)(local_78 + local_38 >> 0xb);
    local_e0[0x70] = (int)(local_78 - local_38 >> 0xb);
    local_e0[0x10] = (int)(local_80 + local_40 >> 0xb);
    local_e0[0x68] = (int)(local_80 - local_40 >> 0xb);
    local_e0[0x18] = (int)(local_88 + local_48 >> 0xb);
    local_e0[0x60] = (int)(local_88 - local_48 >> 0xb);
    local_e0[0x20] = (int)(local_90 + local_50 >> 0xb);
    local_e0[0x58] = (int)(local_90 - local_50 >> 0xb);
    local_e0[0x28] = (int)(local_98 + local_58 >> 0xb);
    local_e0[0x50] = (int)(local_98 - local_58 >> 0xb);
    local_e0[0x30] = (int)(local_a0 + local_60 >> 0xb);
    local_e0[0x48] = (int)(local_a0 - local_60 >> 0xb);
    local_e0[0x38] = (int)(local_a8 + local_68 >> 0xb);
    local_e0[0x40] = (int)(local_a8 - local_68 >> 0xb);
    local_d0 = local_d0 + 1;
    local_d8 = local_d8 + 1;
    local_e0 = local_e0 + 1;
  }
  local_e0 = local_2f8;
  for (local_f4 = 0; local_f4 < 0x10; local_f4 = local_f4 + 1) {
    puVar13 = (undefined1 *)(*(long *)(local_20 + (long)local_f4 * 8) + (ulong)local_24);
    lVar9 = ((long)*local_e0 + 0x10) * 0x2000;
    lVar1 = (long)local_e0[4];
    lVar7 = lVar9 + lVar1 * 0x29cf;
    lVar10 = lVar9 + lVar1 * -0x29cf;
    lVar8 = lVar9 + lVar1 * 0x1151;
    lVar9 = lVar9 + lVar1 * -0x1151;
    lVar1 = (long)local_e0[2];
    lVar2 = (long)local_e0[6];
    lVar3 = (lVar1 - lVar2) * 0x8d4;
    lVar4 = (lVar1 - lVar2) * 0x2c63;
    lVar5 = lVar4 + lVar2 * 0x5203;
    lVar6 = lVar3 + lVar1 * 0x1ccd;
    lVar4 = lVar4 + lVar1 * -0x133e;
    lVar3 = lVar3 + lVar2 * -0x1050;
    lVar1 = lVar7 + lVar5;
    lVar7 = lVar7 - lVar5;
    lVar2 = lVar8 + lVar6;
    lVar8 = lVar8 - lVar6;
    lVar5 = lVar9 + lVar4;
    lVar9 = lVar9 - lVar4;
    lVar6 = lVar10 + lVar3;
    lVar10 = lVar10 - lVar3;
    lVar4 = (long)local_e0[1];
    lVar3 = (long)local_e0[3];
    lVar11 = (long)local_e0[5];
    lVar12 = (long)local_e0[7];
    lVar14 = (lVar4 + lVar3) * 0x2b4e;
    lVar15 = (lVar4 + lVar11) * 0x27e9;
    lVar16 = (lVar4 + lVar12) * 0x22fc;
    lVar17 = (lVar4 - lVar12) * 0x1cb6;
    lVar18 = (lVar4 + lVar11) * 0x1555;
    lVar19 = (lVar4 - lVar3) * 0xd23;
    lVar20 = lVar14 + lVar15 + lVar16 + lVar4 * -0x492a;
    lVar4 = lVar17 + lVar18 + lVar19 + lVar4 * -0x3abe;
    lVar21 = (lVar3 + lVar11) * 0x470;
    lVar22 = (lVar11 - lVar3) * 0x2d09;
    lVar23 = (lVar12 + lVar3) * -0x1555;
    lVar14 = lVar23 + lVar21 + lVar3 * 0x24d + lVar14;
    lVar24 = (lVar12 + lVar3) * -0x27e9;
    lVar3 = lVar24 + lVar22 + lVar3 * 0x3f1a + lVar19;
    lVar19 = (lVar11 + lVar12) * -0x2b4e;
    lVar15 = lVar19 + lVar21 + lVar11 * -0x2406 + lVar15;
    lVar19 = lVar19 + lVar23 + lVar12 * 0x2218 + lVar16;
    lVar16 = (lVar12 - lVar11) * 0xd23;
    lVar12 = lVar16 + lVar24 + lVar12 * 0x6485 + lVar17;
    lVar16 = lVar16 + lVar22 + lVar11 * -0x1886 + lVar18;
    *puVar13 = *(undefined1 *)(local_f0 + (int)((uint)(lVar1 + lVar20 >> 0x12) & 0x3ff));
    puVar13[0xf] = *(undefined1 *)(local_f0 + (int)((uint)(lVar1 - lVar20 >> 0x12) & 0x3ff));
    puVar13[1] = *(undefined1 *)(local_f0 + (int)((uint)(lVar2 + lVar14 >> 0x12) & 0x3ff));
    puVar13[0xe] = *(undefined1 *)(local_f0 + (int)((uint)(lVar2 - lVar14 >> 0x12) & 0x3ff));
    puVar13[2] = *(undefined1 *)(local_f0 + (int)((uint)(lVar5 + lVar15 >> 0x12) & 0x3ff));
    puVar13[0xd] = *(undefined1 *)(local_f0 + (int)((uint)(lVar5 - lVar15 >> 0x12) & 0x3ff));
    puVar13[3] = *(undefined1 *)(local_f0 + (int)((uint)(lVar6 + lVar19 >> 0x12) & 0x3ff));
    puVar13[0xc] = *(undefined1 *)(local_f0 + (int)((uint)(lVar6 - lVar19 >> 0x12) & 0x3ff));
    puVar13[4] = *(undefined1 *)(local_f0 + (int)((uint)(lVar10 + lVar12 >> 0x12) & 0x3ff));
    puVar13[0xb] = *(undefined1 *)(local_f0 + (int)((uint)(lVar10 - lVar12 >> 0x12) & 0x3ff));
    puVar13[5] = *(undefined1 *)(local_f0 + (int)((uint)(lVar9 + lVar16 >> 0x12) & 0x3ff));
    puVar13[10] = *(undefined1 *)(local_f0 + (int)((uint)(lVar9 - lVar16 >> 0x12) & 0x3ff));
    puVar13[6] = *(undefined1 *)(local_f0 + (int)((uint)(lVar8 + lVar3 >> 0x12) & 0x3ff));
    puVar13[9] = *(undefined1 *)(local_f0 + (int)((uint)(lVar8 - lVar3 >> 0x12) & 0x3ff));
    puVar13[7] = *(undefined1 *)(local_f0 + (int)((uint)(lVar7 + lVar4 >> 0x12) & 0x3ff));
    puVar13[8] = *(undefined1 *)(local_f0 + (int)((uint)(lVar7 - lVar4 >> 0x12) & 0x3ff));
    local_e0 = local_e0 + 8;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_16x16(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                JCOEFPTR coef_block, JSAMPARRAY output_buf,
                JDIMENSION output_col)
{
  JLONG tmp0, tmp1, tmp2, tmp3, tmp10, tmp11, tmp12, tmp13;
  JLONG tmp20, tmp21, tmp22, tmp23, tmp24, tmp25, tmp26, tmp27;
  JLONG z1, z2, z3, z4;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[8 * 16];        /* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = 0; ctr < 8; ctr++, inptr++, quantptr++, wsptr++) {
    /* Even part */

    tmp0 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    tmp0 = LEFT_SHIFT(tmp0, CONST_BITS);
    /* Add fudge factor here for final descale. */
    tmp0 += ONE << (CONST_BITS - PASS1_BITS - 1);

    z1 = DEQUANTIZE(inptr[DCTSIZE * 4], quantptr[DCTSIZE * 4]);
    tmp1 = MULTIPLY(z1, FIX(1.306562965));      /* c4[16] = c2[8] */
    tmp2 = MULTIPLY(z1, FIX_0_541196100);       /* c12[16] = c6[8] */

    tmp10 = tmp0 + tmp1;
    tmp11 = tmp0 - tmp1;
    tmp12 = tmp0 + tmp2;
    tmp13 = tmp0 - tmp2;

    z1 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2]);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 6], quantptr[DCTSIZE * 6]);
    z3 = z1 - z2;
    z4 = MULTIPLY(z3, FIX(0.275899379));        /* c14[16] = c7[8] */
    z3 = MULTIPLY(z3, FIX(1.387039845));        /* c2[16] = c1[8] */

    tmp0 = z3 + MULTIPLY(z2, FIX_2_562915447);  /* (c6+c2)[16] = (c3+c1)[8] */
    tmp1 = z4 + MULTIPLY(z1, FIX_0_899976223);  /* (c6-c14)[16] = (c3-c7)[8] */
    tmp2 = z3 - MULTIPLY(z1, FIX(0.601344887)); /* (c2-c10)[16] = (c1-c5)[8] */
    tmp3 = z4 - MULTIPLY(z2, FIX(0.509795579)); /* (c10-c14)[16] = (c5-c7)[8] */

    tmp20 = tmp10 + tmp0;
    tmp27 = tmp10 - tmp0;
    tmp21 = tmp12 + tmp1;
    tmp26 = tmp12 - tmp1;
    tmp22 = tmp13 + tmp2;
    tmp25 = tmp13 - tmp2;
    tmp23 = tmp11 + tmp3;
    tmp24 = tmp11 - tmp3;

    /* Odd part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 5], quantptr[DCTSIZE * 5]);
    z4 = DEQUANTIZE(inptr[DCTSIZE * 7], quantptr[DCTSIZE * 7]);

    tmp11 = z1 + z3;

    tmp1  = MULTIPLY(z1 + z2, FIX(1.353318001));   /* c3 */
    tmp2  = MULTIPLY(tmp11,   FIX(1.247225013));   /* c5 */
    tmp3  = MULTIPLY(z1 + z4, FIX(1.093201867));   /* c7 */
    tmp10 = MULTIPLY(z1 - z4, FIX(0.897167586));   /* c9 */
    tmp11 = MULTIPLY(tmp11,   FIX(0.666655658));   /* c11 */
    tmp12 = MULTIPLY(z1 - z2, FIX(0.410524528));   /* c13 */
    tmp0  = tmp1 + tmp2 + tmp3 -
            MULTIPLY(z1, FIX(2.286341144));        /* c7+c5+c3-c1 */
    tmp13 = tmp10 + tmp11 + tmp12 -
            MULTIPLY(z1, FIX(1.835730603));        /* c9+c11+c13-c15 */
    z1    = MULTIPLY(z2 + z3, FIX(0.138617169));   /* c15 */
    tmp1  += z1 + MULTIPLY(z2, FIX(0.071888074));  /* c9+c11-c3-c15 */
    tmp2  += z1 - MULTIPLY(z3, FIX(1.125726048));  /* c5+c7+c15-c3 */
    z1    = MULTIPLY(z3 - z2, FIX(1.407403738));   /* c1 */
    tmp11 += z1 - MULTIPLY(z3, FIX(0.766367282));  /* c1+c11-c9-c13 */
    tmp12 += z1 + MULTIPLY(z2, FIX(1.971951411));  /* c1+c5+c13-c7 */
    z2    += z4;
    z1    = MULTIPLY(z2, -FIX(0.666655658));       /* -c11 */
    tmp1  += z1;
    tmp3  += z1 + MULTIPLY(z4, FIX(1.065388962));  /* c3+c11+c15-c7 */
    z2    = MULTIPLY(z2, -FIX(1.247225013));       /* -c5 */
    tmp10 += z2 + MULTIPLY(z4, FIX(3.141271809));  /* c1+c5+c9-c13 */
    tmp12 += z2;
    z2    = MULTIPLY(z3 + z4, -FIX(1.353318001));  /* -c3 */
    tmp2  += z2;
    tmp3  += z2;
    z2    = MULTIPLY(z4 - z3, FIX(0.410524528));   /* c13 */
    tmp10 += z2;
    tmp11 += z2;

    /* Final output stage */

    wsptr[8 * 0]  = (int)RIGHT_SHIFT(tmp20 + tmp0,  CONST_BITS - PASS1_BITS);
    wsptr[8 * 15] = (int)RIGHT_SHIFT(tmp20 - tmp0,  CONST_BITS - PASS1_BITS);
    wsptr[8 * 1]  = (int)RIGHT_SHIFT(tmp21 + tmp1,  CONST_BITS - PASS1_BITS);
    wsptr[8 * 14] = (int)RIGHT_SHIFT(tmp21 - tmp1,  CONST_BITS - PASS1_BITS);
    wsptr[8 * 2]  = (int)RIGHT_SHIFT(tmp22 + tmp2,  CONST_BITS - PASS1_BITS);
    wsptr[8 * 13] = (int)RIGHT_SHIFT(tmp22 - tmp2,  CONST_BITS - PASS1_BITS);
    wsptr[8 * 3]  = (int)RIGHT_SHIFT(tmp23 + tmp3,  CONST_BITS - PASS1_BITS);
    wsptr[8 * 12] = (int)RIGHT_SHIFT(tmp23 - tmp3,  CONST_BITS - PASS1_BITS);
    wsptr[8 * 4]  = (int)RIGHT_SHIFT(tmp24 + tmp10, CONST_BITS - PASS1_BITS);
    wsptr[8 * 11] = (int)RIGHT_SHIFT(tmp24 - tmp10, CONST_BITS - PASS1_BITS);
    wsptr[8 * 5]  = (int)RIGHT_SHIFT(tmp25 + tmp11, CONST_BITS - PASS1_BITS);
    wsptr[8 * 10] = (int)RIGHT_SHIFT(tmp25 - tmp11, CONST_BITS - PASS1_BITS);
    wsptr[8 * 6]  = (int)RIGHT_SHIFT(tmp26 + tmp12, CONST_BITS - PASS1_BITS);
    wsptr[8 * 9]  = (int)RIGHT_SHIFT(tmp26 - tmp12, CONST_BITS - PASS1_BITS);
    wsptr[8 * 7]  = (int)RIGHT_SHIFT(tmp27 + tmp13, CONST_BITS - PASS1_BITS);
    wsptr[8 * 8]  = (int)RIGHT_SHIFT(tmp27 - tmp13, CONST_BITS - PASS1_BITS);
  }

  /* Pass 2: process 16 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 16; ctr++) {
    outptr = output_buf[ctr] + output_col;

    /* Even part */

    /* Add fudge factor here for final descale. */
    tmp0 = (JLONG)wsptr[0] + (ONE << (PASS1_BITS + 2));
    tmp0 = LEFT_SHIFT(tmp0, CONST_BITS);

    z1 = (JLONG)wsptr[4];
    tmp1 = MULTIPLY(z1, FIX(1.306562965));      /* c4[16] = c2[8] */
    tmp2 = MULTIPLY(z1, FIX_0_541196100);       /* c12[16] = c6[8] */

    tmp10 = tmp0 + tmp1;
    tmp11 = tmp0 - tmp1;
    tmp12 = tmp0 + tmp2;
    tmp13 = tmp0 - tmp2;

    z1 = (JLONG)wsptr[2];
    z2 = (JLONG)wsptr[6];
    z3 = z1 - z2;
    z4 = MULTIPLY(z3, FIX(0.275899379));        /* c14[16] = c7[8] */
    z3 = MULTIPLY(z3, FIX(1.387039845));        /* c2[16] = c1[8] */

    tmp0 = z3 + MULTIPLY(z2, FIX_2_562915447);  /* (c6+c2)[16] = (c3+c1)[8] */
    tmp1 = z4 + MULTIPLY(z1, FIX_0_899976223);  /* (c6-c14)[16] = (c3-c7)[8] */
    tmp2 = z3 - MULTIPLY(z1, FIX(0.601344887)); /* (c2-c10)[16] = (c1-c5)[8] */
    tmp3 = z4 - MULTIPLY(z2, FIX(0.509795579)); /* (c10-c14)[16] = (c5-c7)[8] */

    tmp20 = tmp10 + tmp0;
    tmp27 = tmp10 - tmp0;
    tmp21 = tmp12 + tmp1;
    tmp26 = tmp12 - tmp1;
    tmp22 = tmp13 + tmp2;
    tmp25 = tmp13 - tmp2;
    tmp23 = tmp11 + tmp3;
    tmp24 = tmp11 - tmp3;

    /* Odd part */

    z1 = (JLONG)wsptr[1];
    z2 = (JLONG)wsptr[3];
    z3 = (JLONG)wsptr[5];
    z4 = (JLONG)wsptr[7];

    tmp11 = z1 + z3;

    tmp1  = MULTIPLY(z1 + z2, FIX(1.353318001));   /* c3 */
    tmp2  = MULTIPLY(tmp11,   FIX(1.247225013));   /* c5 */
    tmp3  = MULTIPLY(z1 + z4, FIX(1.093201867));   /* c7 */
    tmp10 = MULTIPLY(z1 - z4, FIX(0.897167586));   /* c9 */
    tmp11 = MULTIPLY(tmp11,   FIX(0.666655658));   /* c11 */
    tmp12 = MULTIPLY(z1 - z2, FIX(0.410524528));   /* c13 */
    tmp0  = tmp1 + tmp2 + tmp3 -
            MULTIPLY(z1, FIX(2.286341144));        /* c7+c5+c3-c1 */
    tmp13 = tmp10 + tmp11 + tmp12 -
            MULTIPLY(z1, FIX(1.835730603));        /* c9+c11+c13-c15 */
    z1    = MULTIPLY(z2 + z3, FIX(0.138617169));   /* c15 */
    tmp1  += z1 + MULTIPLY(z2, FIX(0.071888074));  /* c9+c11-c3-c15 */
    tmp2  += z1 - MULTIPLY(z3, FIX(1.125726048));  /* c5+c7+c15-c3 */
    z1    = MULTIPLY(z3 - z2, FIX(1.407403738));   /* c1 */
    tmp11 += z1 - MULTIPLY(z3, FIX(0.766367282));  /* c1+c11-c9-c13 */
    tmp12 += z1 + MULTIPLY(z2, FIX(1.971951411));  /* c1+c5+c13-c7 */
    z2    += z4;
    z1    = MULTIPLY(z2, -FIX(0.666655658));       /* -c11 */
    tmp1  += z1;
    tmp3  += z1 + MULTIPLY(z4, FIX(1.065388962));  /* c3+c11+c15-c7 */
    z2    = MULTIPLY(z2, -FIX(1.247225013));       /* -c5 */
    tmp10 += z2 + MULTIPLY(z4, FIX(3.141271809));  /* c1+c5+c9-c13 */
    tmp12 += z2;
    z2    = MULTIPLY(z3 + z4, -FIX(1.353318001));  /* -c3 */
    tmp2  += z2;
    tmp3  += z2;
    z2    = MULTIPLY(z4 - z3, FIX(0.410524528));   /* c13 */
    tmp10 += z2;
    tmp11 += z2;

    /* Final output stage */

    outptr[0]  = range_limit[(int)RIGHT_SHIFT(tmp20 + tmp0,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[15] = range_limit[(int)RIGHT_SHIFT(tmp20 - tmp0,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[1]  = range_limit[(int)RIGHT_SHIFT(tmp21 + tmp1,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[14] = range_limit[(int)RIGHT_SHIFT(tmp21 - tmp1,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[2]  = range_limit[(int)RIGHT_SHIFT(tmp22 + tmp2,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[13] = range_limit[(int)RIGHT_SHIFT(tmp22 - tmp2,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[3]  = range_limit[(int)RIGHT_SHIFT(tmp23 + tmp3,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[12] = range_limit[(int)RIGHT_SHIFT(tmp23 - tmp3,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[4]  = range_limit[(int)RIGHT_SHIFT(tmp24 + tmp10,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[11] = range_limit[(int)RIGHT_SHIFT(tmp24 - tmp10,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[5]  = range_limit[(int)RIGHT_SHIFT(tmp25 + tmp11,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[10] = range_limit[(int)RIGHT_SHIFT(tmp25 - tmp11,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[6]  = range_limit[(int)RIGHT_SHIFT(tmp26 + tmp12,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[9]  = range_limit[(int)RIGHT_SHIFT(tmp26 - tmp12,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[7]  = range_limit[(int)RIGHT_SHIFT(tmp27 + tmp13,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[8]  = range_limit[(int)RIGHT_SHIFT(tmp27 - tmp13,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];

    wsptr += 8;         /* advance pointer to next row */
  }
}